

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_build_rest(JSContext *ctx,int first,int argc,JSValue *argv)

{
  JSValue this_obj;
  JSValue JVar1;
  int iVar2;
  long in_RCX;
  int in_EDX;
  int in_ESI;
  JSContext *in_RDI;
  JSValue JVar3;
  JSValue JVar4;
  int ret;
  int i;
  JSValue val;
  JSContext *in_stack_ffffffffffffff90;
  JSContext *ctx_00;
  undefined4 in_stack_ffffffffffffff98;
  JSValueUnion JVar5;
  JSValueUnion ctx_01;
  int64_t iVar6;
  int in_stack_ffffffffffffffc0;
  int iVar7;
  JSValueUnion JVar8;
  undefined4 local_10;
  undefined4 uStack_c;
  undefined8 local_8;
  
  JVar3 = JS_NewArray(in_stack_ffffffffffffff90);
  ctx_01 = JVar3.u;
  iVar6 = JVar3.tag;
  JVar8 = ctx_01;
  local_8 = iVar6;
  iVar2 = JS_IsException(JVar3);
  iVar7 = in_ESI;
  if (iVar2 == 0) {
    for (; iVar7 < in_EDX; iVar7 = iVar7 + 1) {
      iVar2 = iVar7 - in_ESI;
      ctx_00 = in_RDI;
      JVar4 = JS_DupValue(in_RDI,*(JSValue *)(in_RCX + (long)iVar7 * 0x10));
      JVar5 = JVar4.u;
      this_obj.tag = local_8;
      this_obj.u.float64 = JVar8.float64;
      JVar3.tag._0_4_ = in_stack_ffffffffffffffc0;
      JVar3.u = (JSValueUnion)iVar6;
      JVar3.tag._4_4_ = iVar7;
      in_stack_ffffffffffffffc0 =
           JS_DefinePropertyValueUint32
                     ((JSContext *)ctx_01.ptr,this_obj,JVar4.tag._4_4_,JVar3,val.u.int32);
      if (in_stack_ffffffffffffffc0 < 0) {
        JVar4.u._4_4_ = iVar2;
        JVar4.u.int32 = in_stack_ffffffffffffff98;
        JVar4.tag = (int64_t)JVar5.ptr;
        JS_FreeValue(ctx_00,JVar4);
        local_10 = 0;
        local_8 = 6;
        goto LAB_0015ba24;
      }
    }
    local_10 = JVar8.int32;
    uStack_c = JVar8._4_4_;
  }
  else {
    local_10 = JVar8.int32;
    uStack_c = JVar8._4_4_;
  }
LAB_0015ba24:
  JVar1.u._4_4_ = uStack_c;
  JVar1.u.int32 = local_10;
  JVar1.tag = local_8;
  return JVar1;
}

Assistant:

static JSValue js_build_rest(JSContext *ctx, int first, int argc, JSValueConst *argv)
{
    JSValue val;
    int i, ret;

    val = JS_NewArray(ctx);
    if (JS_IsException(val))
        return val;
    for (i = first; i < argc; i++) {
        ret = JS_DefinePropertyValueUint32(ctx, val, i - first,
                                           JS_DupValue(ctx, argv[i]),
                                           JS_PROP_C_W_E);
        if (ret < 0) {
            JS_FreeValue(ctx, val);
            return JS_EXCEPTION;
        }
    }
    return val;
}